

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

bool pbrt::upgradeRGBToScale(ParameterDictionary *dict,char *name,Float *totalScale)

{
  ParsedParameter *pPVar1;
  Allocator alloc;
  bool bVar2;
  optional<pbrt::RGB> rgb;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> s;
  allocator<char> local_71;
  float local_70;
  float local_6c;
  float local_68;
  char local_64;
  undefined1 local_60 [32];
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,name,(allocator<char> *)&local_70);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  ParameterDictionary::GetSpectrumArray(&local_40,dict,(string *)local_60,Unbounded,alloc);
  pPVar1 = (ParsedParameter *)(local_60 + 0x10);
  if ((ParsedParameter *)local_60._0_8_ != pPVar1) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (local_40.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_40.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,name,&local_71);
    ParameterDictionary::GetOneRGB((ParameterDictionary *)&local_70,(string *)dict);
    if ((ParsedParameter *)local_60._0_8_ != pPVar1) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    if (local_64 == '\x01') {
      bVar2 = false;
      if (local_70 == local_6c) {
        bVar2 = false;
        if ((local_6c == local_68) && (!NAN(local_6c) && !NAN(local_68))) {
          *totalScale = local_70 * *totalScale;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_60,name,&local_71);
          ParameterDictionary::RemoveSpectrum(dict,(string *)local_60);
          if ((ParsedParameter *)local_60._0_8_ != pPVar1) {
            operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
          }
          bVar2 = true;
        }
      }
    }
    else {
      bVar2 = false;
    }
    if (local_64 == '\x01') {
      local_64 = '\0';
    }
  }
  if ((ParsedParameter *)
      local_40.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (ParsedParameter *)0x0) {
    operator_delete(local_40.
                    super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

static bool upgradeRGBToScale(ParameterDictionary *dict, const char *name,
                              Float *totalScale) {
    std::vector<SpectrumHandle> s =
        dict->GetSpectrumArray(name, SpectrumType::Unbounded, {});
    if (s.empty())
        return true;

    pstd::optional<RGB> rgb = dict->GetOneRGB(name);
    if (!rgb || rgb->r != rgb->g || rgb->g != rgb->b)
        return false;

    *totalScale *= rgb->r;
    dict->RemoveSpectrum(name);
    return true;
}